

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong __thiscall mkvparser::Cluster::GetTime(Cluster *this)

{
  longlong lVar1;
  
  lVar1 = GetTimeCode(this);
  if (-1 < lVar1) {
    lVar1 = this->m_timecode * this->m_pSegment->m_pInfo->m_timecodeScale;
  }
  return lVar1;
}

Assistant:

long long Cluster::GetTime() const {
  const long long tc = GetTimeCode();

  if (tc < 0)
    return tc;

  const SegmentInfo* const pInfo = m_pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  const long long t = m_timecode * scale;

  return t;
}